

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O1

shared_ptr<MainLoop> MainLoop::Init(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  MainLoop *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  element_type *in_RDI;
  bool bVar3;
  shared_ptr<MainLoop> sVar4;
  
  if (__MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00107c80;
    __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    *(undefined4 *)&p_Var2[1]._vptr__Sp_counted_base = 0x3dcccccd;
    _Var1 = __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    bVar3 = __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    in_RDX._M_pi = extraout_RDX;
    __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2
    ;
    if (bVar3) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  *(element_type **)in_RDI =
       __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var1 = __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RDI + 2) =
       __MainLoop__.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
    }
  }
  sVar4.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<MainLoop>)sVar4.super___shared_ptr<MainLoop,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MainLoop> MainLoop::Init()
{
	if (__MainLoop__ == NULL)
	{
		__MainLoop__ = std::make_shared<MainLoop>();
	}
	return __MainLoop__;
}